

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)21>_> *
vkt::api::anon_unknown_1::DescriptorPool::create
          (Move<vk::Handle<(vk::HandleType)21>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  bool bVar1;
  size_type sVar2;
  const_reference local_70;
  undefined1 local_50 [8];
  VkDescriptorPoolCreateInfo descriptorPoolInfo;
  Parameters *params_local;
  Resources *param_1_local;
  Environment *env_local;
  
  local_50._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  descriptorPoolInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorPoolInfo._4_4_ = 0;
  descriptorPoolInfo.pNext._0_4_ = params->flags;
  descriptorPoolInfo.pNext._4_4_ = params->maxSets;
  descriptorPoolInfo.pPoolSizes = (VkDescriptorPoolSize *)params;
  sVar2 = std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::size
                    (&params->poolSizes);
  descriptorPoolInfo.flags = (VkDescriptorPoolCreateFlags)sVar2;
  bVar1 = std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::empty
                    ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                     (descriptorPoolInfo.pPoolSizes + 1));
  if (bVar1) {
    local_70 = (const_reference)0x0;
  }
  else {
    local_70 = std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
               operator[]((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                           *)(descriptorPoolInfo.pPoolSizes + 1),0);
  }
  descriptorPoolInfo._24_8_ = local_70;
  ::vk::createDescriptorPool
            (__return_storage_ptr__,env->vkd,env->device,(VkDescriptorPoolCreateInfo *)local_50,
             env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDescriptorPool> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkDescriptorPoolCreateInfo	descriptorPoolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			params.flags,
			params.maxSets,
			(deUint32)params.poolSizes.size(),
			(params.poolSizes.empty() ? DE_NULL : &params.poolSizes[0])
		};

		return createDescriptorPool(env.vkd, env.device, &descriptorPoolInfo, env.allocationCallbacks);
	}